

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int conn_in_use(conn_handle *conn)

{
  void *pvVar1;
  uint local_1c;
  int ret;
  conn_priv *priv;
  conn_handle *conn_local;
  
  pvVar1 = conn->priv;
  mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x90));
  local_1c = (uint)(*(int *)((long)pvVar1 + 8) != -1);
  mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x90));
  return local_1c;
}

Assistant:

int conn_in_use(struct conn_handle *conn)
{
	struct conn_priv *priv = conn->priv;
	int ret = 0;

	mutex_lock_shared(&priv->mutex);

	if (priv->fd != INVALID_SOCKET)
		ret = 1;

	mutex_unlock_shared(&priv->mutex);

	return ret;
}